

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O2

shared_ptr<cppcms::session_api> __thiscall
cppcms::session_pool::cookies_factory::get(cookies_factory *this)

{
  undefined8 *puVar1;
  encryptor *in_RAX;
  session_cookies *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  pointer *__ptr;
  long in_RSI;
  shared_ptr<cppcms::session_api> sVar2;
  _Head_base<0UL,_cppcms::sessions::encryptor_*,_false> local_28;
  
  (this->super_session_api_factory)._vptr_session_api_factory = (_func_int **)0x0;
  this->pool_ = (session_pool *)0x0;
  puVar1 = *(undefined8 **)(*(long *)(in_RSI + 8) + 0x10);
  if (puVar1 != (undefined8 *)0x0) {
    local_28._M_head_impl = in_RAX;
    this_00 = (session_cookies *)operator_new(0x18);
    (**(code **)*puVar1)(&local_28,puVar1);
    sessions::session_cookies::session_cookies
              (this_00,(unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                        *)&local_28);
    std::__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_cookies>
              ((__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    in_RDX._M_pi = extraout_RDX;
    if (local_28._M_head_impl != (encryptor *)0x0) {
      (*(local_28._M_head_impl)->_vptr_encryptor[3])();
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::session_api>)
         sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<session_api> get() 
	{
		booster::shared_ptr<session_api> p;
		if(pool_->encryptor_.get())
			p.reset(new session_cookies(pool_->encryptor_->get()));
		return p;
	}